

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O2

void __thiscall
Qentem::StringUtils::EscapeHTMLSpecialChars<Qentem::StringStream<wchar_t>,wchar_t>
          (StringUtils *this,StringStream<wchar_t> *stream,wchar_t *str,SizeT length)

{
  wchar_t *left;
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  undefined4 in_register_0000000c;
  ulong __n;
  uint uVar5;
  int iVar6;
  uint uVar7;
  void *pvStack_40;
  
  __n = CONCAT44(in_register_0000000c,length);
  uVar5 = 0;
  uVar7 = 0;
LAB_0010afc9:
  do {
    uVar2 = (uint)str;
    uVar4 = uVar2 - uVar5;
    iVar6 = (int)stream;
    if (uVar2 <= uVar5) {
      StringStream<wchar_t>::write
                ((StringStream<wchar_t> *)this,iVar6 + uVar7 * 4,(void *)(ulong)(uVar2 - uVar7),__n)
      ;
      return;
    }
    __n = (ulong)uVar5;
    iVar1 = *(int *)((long)&stream->storage_ + __n * 4);
    if (iVar1 == 0x22) {
      StringStream<wchar_t>::write
                ((StringStream<wchar_t> *)this,iVar6 + uVar7 * 4,(void *)(ulong)(uVar5 - uVar7),__n)
      ;
      iVar6 = 0x11edf8;
LAB_0010b0d3:
      pvStack_40 = (void *)0x6;
    }
    else {
      if (iVar1 != 0x3e) {
        if (iVar1 == 0x27) {
          StringStream<wchar_t>::write
                    ((StringStream<wchar_t> *)this,iVar6 + uVar7 * 4,(void *)(ulong)(uVar5 - uVar7),
                     __n);
          iVar6 = 0x11ff80;
          goto LAB_0010b0d3;
        }
        if (iVar1 == 0x3c) {
          StringStream<wchar_t>::write
                    ((StringStream<wchar_t> *)this,iVar6 + uVar7 * 4,(void *)(ulong)(uVar5 - uVar7),
                     __n);
          iVar6 = 0x11ef90;
          goto LAB_0010b090;
        }
        if (iVar1 == 0x26) {
          left = (wchar_t *)((long)&stream->storage_ + __n * 4);
          if (uVar4 < 6) {
            if (uVar4 == 5) goto LAB_0010b0ea;
            if (3 < uVar4) goto LAB_0010b11a;
          }
          else {
            if (left[5] == L';') {
              bVar3 = IsEqual<wchar_t>(left,L"&quot;",5);
              if (!bVar3) {
                bVar3 = IsEqual<wchar_t>(left,L"&apos;",5);
                if (!bVar3) goto LAB_0010b0ea;
              }
              uVar5 = uVar5 + 6;
              goto LAB_0010afc9;
            }
LAB_0010b0ea:
            if (left[4] == L';') {
              bVar3 = IsEqual<wchar_t>(left,L"&amp;",4);
              if (bVar3) {
                uVar5 = uVar5 + 5;
                goto LAB_0010afc9;
              }
            }
LAB_0010b11a:
            if (left[3] == L';') {
              bVar3 = IsEqual<wchar_t>(left,L"&lt;",3);
              if (!bVar3) {
                bVar3 = IsEqual<wchar_t>(left,L"&gt;",3);
                if (!bVar3) goto LAB_0010b15b;
              }
              uVar5 = uVar5 + 4;
              goto LAB_0010afc9;
            }
          }
LAB_0010b15b:
          StringStream<wchar_t>::write
                    ((StringStream<wchar_t> *)this,iVar6 + uVar7 * 4,(void *)(ulong)(uVar5 - uVar7),
                     __n);
          StringStream<wchar_t>::write((StringStream<wchar_t> *)this,0x11f090,(void *)0x5,__n);
          uVar5 = uVar5 + 1;
          uVar7 = uVar5;
        }
        else {
          uVar5 = uVar5 + 1;
        }
        goto LAB_0010afc9;
      }
      StringStream<wchar_t>::write
                ((StringStream<wchar_t> *)this,iVar6 + uVar7 * 4,(void *)(ulong)(uVar5 - uVar7),__n)
      ;
      iVar6 = 0x11ebc8;
LAB_0010b090:
      pvStack_40 = (void *)0x4;
    }
    StringStream<wchar_t>::write((StringStream<wchar_t> *)this,iVar6,pvStack_40,__n);
    uVar5 = uVar5 + 1;
    uVar7 = uVar5;
  } while( true );
}

Assistant:

static void EscapeHTMLSpecialChars(StringStream_T &stream, const Char_T *str, SizeT length) {
    using HTMLSpecialChars = HTMLSpecialChars_T<Char_T, sizeof(Char_T)>;

    if (Config::AutoEscapeHTML) {
        SizeT offset = 0;
        SizeT index  = 0;

        while (index < length) {
            switch (str[index]) {
                case '&': {
                    const SizeT   rem_length = (length - index);
                    const Char_T *n_str      = (str + index);

                    if ((rem_length > SizeT{5}) && (n_str[SizeT{5}] == HTMLSpecialChars::SemicolonChar)) {
                        if (StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLQuote, SizeT{5}) ||
                            StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLSingleQuote, SizeT{5})) {
                            index += SizeT{6};
                            break;
                        }
                    }

                    if ((rem_length > SizeT{4}) && (n_str[SizeT{4}] == HTMLSpecialChars::SemicolonChar) &&
                        StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLAnd, SizeT{4})) {
                        index += SizeT{5};
                        break;
                    }

                    if ((rem_length > SizeT{3}) && (n_str[SizeT{3}] == HTMLSpecialChars::SemicolonChar)) {
                        if (StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLLess, SizeT{3}) ||
                            StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLGreater, SizeT{3})) {
                            index += SizeT{4};
                            break;
                        }
                    }

                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLAnd, HTMLSpecialChars::HTMLAndLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '<': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLLess, HTMLSpecialChars::HTMLLessLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '>': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLGreater, HTMLSpecialChars::HTMLGreaterLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '"': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLQuote, HTMLSpecialChars::HTMLQuoteLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '\'': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLSingleQuote, HTMLSpecialChars::HTMLSingleQuoteLength);
                    ++index;
                    offset = index;
                    break;
                }

                default: {
                    ++index;
                }
            }
        }

        stream.Write((str + offset), (length - offset));
    } else {
        stream.Write(str, length);
    }
}